

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableSortSpecsSanitize(ImGuiTable *table)

{
  ImGuiTableColumn *pIVar1;
  uint uVar2;
  short sVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  int column_n;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar5 = (ulong)(uint)table->ColumnsCount;
  if (table->ColumnsCount < 1) {
    uVar5 = 0;
  }
  lVar4 = uVar5 * 0x70;
  uVar6 = 0;
  uVar2 = 0;
  for (lVar8 = 0; lVar4 - lVar8 != 0; lVar8 = lVar8 + 0x70) {
    pIVar1 = (table->Columns).Data;
    sVar3 = *(short *)((long)&pIVar1->SortOrder + lVar8);
    if (sVar3 == -1) {
LAB_001865d4:
      sVar3 = -1;
    }
    else if ((&pIVar1->IsEnabled)[lVar8] == false) {
      *(undefined2 *)((long)&pIVar1->SortOrder + lVar8) = 0xffff;
      goto LAB_001865d4;
    }
    uVar10 = 1L << ((byte)sVar3 & 0x3f);
    if (sVar3 == -1) {
      uVar10 = 0;
    }
    uVar6 = uVar6 | uVar10;
    uVar2 = uVar2 + (sVar3 != -1);
  }
  if (uVar2 < 2) {
    bVar11 = false;
  }
  else {
    bVar11 = (table->Flags & 0x4000000) == 0;
  }
  if (1L << ((byte)uVar2 & 0x3f) != uVar6 + 1 || bVar11) {
    uVar6 = 0;
    for (uVar7 = 0; uVar7 < uVar2; uVar7 = uVar7 + 1) {
      lVar8 = 0x5a;
      uVar9 = 0xffffffff;
      for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
        if ((uVar6 >> (uVar10 & 0x3f) & 1) == 0) {
          pIVar1 = (table->Columns).Data;
          sVar3 = *(short *)((long)&pIVar1->Flags + lVar8);
          if ((sVar3 != -1) && ((uVar9 == 0xffffffff || (sVar3 < pIVar1[(int)uVar9].SortOrder)))) {
            uVar9 = (uint)uVar10;
          }
        }
        lVar8 = lVar8 + 0x70;
      }
      pIVar1 = (table->Columns).Data;
      pIVar1[(int)uVar9].SortOrder = (ImGuiTableColumnIdx)uVar7;
      if (bVar11) {
        uVar2 = 1;
        for (lVar8 = 0; lVar4 - lVar8 != 0; lVar8 = lVar8 + 0x70) {
          if ((ulong)uVar9 * 0x70 - lVar8 != 0) {
            *(undefined2 *)((long)&pIVar1->SortOrder + lVar8) = 0xffff;
          }
        }
        goto LAB_00186708;
      }
      uVar6 = uVar6 | 1L << ((ulong)uVar9 & 0x3f);
    }
  }
  if ((uVar2 == 0) && (uVar2 = 0, (table->Flags & 0x8000000) == 0)) {
    uVar2 = 0;
    for (lVar8 = 0; lVar4 - lVar8 != 0; lVar8 = lVar8 + 0x70) {
      pIVar1 = (table->Columns).Data;
      if (((&pIVar1->IsEnabled)[lVar8] == true) &&
         ((*(byte *)((long)&pIVar1->Flags + lVar8 + 1) & 2) == 0)) {
        *(undefined2 *)((long)&pIVar1->SortOrder + lVar8) = 0;
        (&pIVar1->field_0x6d)[lVar8] =
             (&pIVar1->field_0x6d)[lVar8] & 0xfc | (&pIVar1->SortDirectionsAvailList)[lVar8] & 3;
        uVar2 = 1;
        break;
      }
    }
  }
LAB_00186708:
  table->SortSpecsCount = (ImGuiTableColumnIdx)uVar2;
  return;
}

Assistant:

void ImGui::TableSortSpecsSanitize(ImGuiTable* table)
{
    IM_ASSERT(table->Flags & ImGuiTableFlags_Sortable);

    // Clear SortOrder from hidden column and verify that there's no gap or duplicate.
    int sort_order_count = 0;
    ImU64 sort_order_mask = 0x00;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder != -1 && !column->IsEnabled)
            column->SortOrder = -1;
        if (column->SortOrder == -1)
            continue;
        sort_order_count++;
        sort_order_mask |= ((ImU64)1 << column->SortOrder);
        IM_ASSERT(sort_order_count < (int)sizeof(sort_order_mask) * 8);
    }

    const bool need_fix_linearize = ((ImU64)1 << sort_order_count) != (sort_order_mask + 1);
    const bool need_fix_single_sort_order = (sort_order_count > 1) && !(table->Flags & ImGuiTableFlags_SortMulti);
    if (need_fix_linearize || need_fix_single_sort_order)
    {
        ImU64 fixed_mask = 0x00;
        for (int sort_n = 0; sort_n < sort_order_count; sort_n++)
        {
            // Fix: Rewrite sort order fields if needed so they have no gap or duplicate.
            // (e.g. SortOrder 0 disappeared, SortOrder 1..2 exists --> rewrite then as SortOrder 0..1)
            int column_with_smallest_sort_order = -1;
            for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                if ((fixed_mask & ((ImU64)1 << (ImU64)column_n)) == 0 && table->Columns[column_n].SortOrder != -1)
                    if (column_with_smallest_sort_order == -1 || table->Columns[column_n].SortOrder < table->Columns[column_with_smallest_sort_order].SortOrder)
                        column_with_smallest_sort_order = column_n;
            IM_ASSERT(column_with_smallest_sort_order != -1);
            fixed_mask |= ((ImU64)1 << column_with_smallest_sort_order);
            table->Columns[column_with_smallest_sort_order].SortOrder = (ImGuiTableColumnIdx)sort_n;

            // Fix: Make sure only one column has a SortOrder if ImGuiTableFlags_MultiSortable is not set.
            if (need_fix_single_sort_order)
            {
                sort_order_count = 1;
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                    if (column_n != column_with_smallest_sort_order)
                        table->Columns[column_n].SortOrder = -1;
                break;
            }
        }
    }

    // Fallback default sort order (if no column with the ImGuiTableColumnFlags_DefaultSort flag)
    if (sort_order_count == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if (column->IsEnabled && !(column->Flags & ImGuiTableColumnFlags_NoSort))
            {
                sort_order_count = 1;
                column->SortOrder = 0;
                column->SortDirection = (ImU8)TableGetColumnAvailSortDirection(column, 0);
                break;
            }
        }

    table->SortSpecsCount = (ImGuiTableColumnIdx)sort_order_count;
}